

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::option_exists_error::~option_exists_error(option_exists_error *this)

{
  option_exists_error *this_local;
  
  ~option_exists_error(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

option_exists_error(const std::string& option)
    : OptionSpecException("Option " + LQUOTE + option + RQUOTE + " already exists")
    {
    }